

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O0

int testGccDepfileReader(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *pvVar4;
  undefined1 local_158 [8];
  cmGccDepfileContent expected;
  string local_138;
  undefined1 local_118 [8];
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> actual;
  string plainDepfile;
  string depfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string base;
  int i;
  int numberOfTestFiles;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string dataDirPath;
  char **argv_local;
  int argc_local;
  
  dataDirPath.field_2._8_8_ = argv;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    argv_local._4_4_ = -1;
  }
  else {
    pcVar3 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar3,&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::__cxx11::string::operator+=((string *)local_38,"/testGccDepfileReader_data");
    for (base.field_2._12_4_ = 1; (int)base.field_2._12_4_ < 8;
        base.field_2._12_4_ = base.field_2._12_4_ + 1) {
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     "/deps");
      std::__cxx11::to_string((string *)((long)&depfile.field_2 + 8),base.field_2._12_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&depfile.field_2 + 8));
      std::__cxx11::string::~string((string *)(depfile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&plainDepfile.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     ".d");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &actual.
                      super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                      ._M_engaged,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     ".txt");
      poVar2 = std::operator<<((ostream *)&std::cout,"Comparing ");
      poVar2 = std::operator<<(poVar2,(string *)local_78);
      poVar2 = std::operator<<(poVar2," with ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &actual.
                                       super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                       ._M_engaged);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::string((string *)&local_138);
      cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                        *)local_118,pcVar3,&local_138,All);
      std::__cxx11::string::~string((string *)&local_138);
      bVar1 = cmsys::SystemTools::FileExists
                        ((string *)
                         &actual.
                          super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                          ._M_engaged);
      if (bVar1) {
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_118);
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          anon_unknown.dwarf_6a39a::readPlainDepfile((cmGccDepfileContent *)local_158,pcVar3);
          pvVar4 = std::
                   optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                   ::operator*((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                *)local_118);
          bVar1 = anon_unknown.dwarf_6a39a::compare(pvVar4,(cmGccDepfileContent *)local_158);
          if (!bVar1) {
            pvVar4 = std::
                     optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                     ::operator*((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                  *)local_118);
            anon_unknown.dwarf_6a39a::dump("actual",pvVar4);
            anon_unknown.dwarf_6a39a::dump("expected",(cmGccDepfileContent *)local_158);
            argv_local._4_4_ = 1;
          }
          expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                    ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)
                     local_158);
          if (expected.
              super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) goto LAB_001dcd08;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Reading ");
          poVar2 = std::operator<<(poVar2,(string *)(plainDepfile.field_2._M_local_buf + 8));
          std::operator<<(poVar2," should have succeeded\n");
          argv_local._4_4_ = 1;
          expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
      }
      else {
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_118);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Reading ");
          poVar2 = std::operator<<(poVar2,(string *)(plainDepfile.field_2._M_local_buf + 8));
          std::operator<<(poVar2," should have failed\n");
          argv_local._4_4_ = 1;
          expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        else {
LAB_001dcd08:
          expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
      }
      std::optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>::
      ~optional((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 *)local_118);
      std::__cxx11::string::~string
                ((string *)
                 &actual.
                  super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                  ._M_engaged);
      std::__cxx11::string::~string((string *)(plainDepfile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_78);
      if (expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_001dcd9b;
    }
    argv_local._4_4_ = 0;
    expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_001dcd9b:
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int testGccDepfileReader(int argc, char* argv[])
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  std::string dataDirPath = argv[1];
  dataDirPath += "/testGccDepfileReader_data";
  const int numberOfTestFiles = 7; // 6th file doesn't exist
  for (int i = 1; i <= numberOfTestFiles; ++i) {
    const std::string base = dataDirPath + "/deps" + std::to_string(i);
    const std::string depfile = base + ".d";
    const std::string plainDepfile = base + ".txt";
    std::cout << "Comparing " << base << " with " << plainDepfile << std::endl;
    const auto actual = cmReadGccDepfile(depfile.c_str());
    if (cmSystemTools::FileExists(plainDepfile)) {
      if (!actual) {
        std::cerr << "Reading " << depfile << " should have succeeded\n";
        return 1;
      }
      const auto expected = readPlainDepfile(plainDepfile.c_str());
      if (!compare(*actual, expected)) {
        dump("actual", *actual);
        dump("expected", expected);
        return 1;
      }
    } else if (actual) {
      std::cerr << "Reading " << depfile << " should have failed\n";
      return 1;
    }
  }

  return 0;
}